

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O1

void deMemory_selfTest(void)

{
  long lVar1;
  size_t alignBytes;
  ulong numBytes;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  void *local_38;
  
  lVar5 = 8;
  do {
    sVar6 = *(size_t *)(&UNK_00122f18 + lVar5);
    lVar1 = *(long *)((long)&deMemory_selfTest::s_alignedAllocCases[0].numBytes + lVar5);
    local_38 = (void *)0x0;
    iVar2 = posix_memalign(&local_38,lVar1 + 7U & 0xfffffffffffffff8,sVar6);
    pvVar3 = (void *)0x0;
    if (iVar2 == 0) {
      pvVar3 = local_38;
    }
    if (pvVar3 == (void *)0x0) {
      deAssertFail("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x141);
    }
    if ((lVar1 - 1U & (ulong)pvVar3) != 0) {
      deAssertFail("deIsAlignedPtr(ptr, s_alignedAllocCases[caseNdx].alignment)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x142);
    }
    memset(pvVar3,0xaa,sVar6);
    free(pvVar3);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0xb8);
  lVar5 = 0;
  do {
    sVar6 = deMemory_selfTest::s_alignedReallocCases[lVar5].initialSize;
    alignBytes = deMemory_selfTest::s_alignedReallocCases[lVar5].alignment;
    local_38 = (void *)0x0;
    iVar2 = posix_memalign(&local_38,alignBytes + 7 & 0xfffffffffffffff8,sVar6);
    pvVar3 = (void *)0x0;
    if (iVar2 == 0) {
      pvVar3 = local_38;
    }
    if (pvVar3 == (void *)0x0) {
      deAssertFail("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x14d);
    }
    uVar7 = alignBytes - 1 & (ulong)pvVar3;
    if (uVar7 != 0) {
      deAssertFail("deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x14e);
    }
    memset(pvVar3,0xaa,sVar6);
    numBytes = deMemory_selfTest::s_alignedReallocCases[lVar5].newSize;
    pvVar3 = deAlignedRealloc(pvVar3,numBytes,alignBytes);
    if (numBytes < sVar6) {
      sVar6 = numBytes;
    }
    if (pvVar3 == (void *)0x0) {
      deAssertFail("newPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x159);
    }
    if (uVar7 != 0) {
      deAssertFail("deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x15a);
    }
    if (sVar6 != 0) {
      sVar4 = 0;
      do {
        if (*(char *)((long)pvVar3 + sVar4) != -0x56) {
          deAssertFail("*((const deUint8*)newPtr + off) == 0xaa",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                       ,0x15d);
        }
        sVar4 = sVar4 + 1;
      } while (sVar6 != sVar4);
    }
    free(pvVar3);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xf);
  return;
}

Assistant:

void deMemory_selfTest (void)
{
	static const struct
	{
		size_t		numBytes;
		size_t		alignment;
	} s_alignedAllocCases[] =
	{
		{ 1,		1		},
		{ 1,		2		},
		{ 1,		256		},
		{ 1,		4096	},
		{ 547389,	1		},
		{ 547389,	2		},
		{ 547389,	256		},
		{ 547389,	4096	},
		{ 52532,	1<<4	},
		{ 52532,	1<<10	},
		{ 52532,	1<<16	},
	};
	static const struct
	{
		size_t		initialSize;
		size_t		newSize;
		size_t		alignment;
	} s_alignedReallocCases[] =
	{
		{ 1,		1,		1		},
		{ 1,		1,		2		},
		{ 1,		1,		256		},
		{ 1,		1,		4096	},
		{ 1,		1241,	1		},
		{ 1,		1241,	2		},
		{ 1,		1241,	256		},
		{ 1,		1241,	4096	},
		{ 547389,	234,	1		},
		{ 547389,	234,	2		},
		{ 547389,	234,	256		},
		{ 547389,	234,	4096	},
		{ 52532,	421523,	1<<4	},
		{ 52532,	421523,	1<<10	},
		{ 52532,	421523,	1<<16	},
	};

	int caseNdx;

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_alignedAllocCases); caseNdx++)
	{
		void* const		ptr		= deAlignedMalloc(s_alignedAllocCases[caseNdx].numBytes, s_alignedAllocCases[caseNdx].alignment);

		DE_TEST_ASSERT(ptr);
		DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedAllocCases[caseNdx].alignment));

		deMemset(ptr, 0xaa, s_alignedAllocCases[caseNdx].numBytes);

		deAlignedFree(ptr);
	}

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_alignedReallocCases); caseNdx++)
	{
		void* const		ptr		= deAlignedMalloc(s_alignedReallocCases[caseNdx].initialSize, s_alignedReallocCases[caseNdx].alignment);

		DE_TEST_ASSERT(ptr);
		DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment));

		deMemset(ptr, 0xaa, s_alignedReallocCases[caseNdx].initialSize);

		{
			void* const		newPtr			= deAlignedRealloc(ptr, s_alignedReallocCases[caseNdx].newSize, s_alignedReallocCases[caseNdx].alignment);
			const size_t	numPreserved	= s_alignedReallocCases[caseNdx].newSize < s_alignedReallocCases[caseNdx].initialSize
											? s_alignedReallocCases[caseNdx].newSize
											: s_alignedReallocCases[caseNdx].initialSize;
			size_t			off;

			DE_TEST_ASSERT(newPtr);
			DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment));

			for (off = 0; off < numPreserved; off++)
				DE_TEST_ASSERT(*((const deUint8*)newPtr + off) == 0xaa);

			deAlignedFree(newPtr);
		}
	}
}